

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QRect __thiscall QToolBarAreaLayout::rectHint(QToolBarAreaLayout *this,QRect *r)

{
  long lVar1;
  QRect QVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  QRect *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int coef;
  QSize bottom_hint;
  QSize top_hint;
  QSize right_hint;
  QSize left_hint;
  QRect result;
  undefined1 *puVar6;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (*(byte *)(in_RDI + 0xf8) & 1) - 1;
  uVar4 = uVar3 | 1;
  QVar2 = *in_RSI;
  puVar6 = &DAT_aaaaaaaaaaaaaaaa;
  QToolBarAreaLayoutInfo::sizeHint
            ((QToolBarAreaLayoutInfo *)(CONCAT44(uVar3,in_stack_ffffffffffffffb0) | 0x100000000));
  QToolBarAreaLayoutInfo::sizeHint
            ((QToolBarAreaLayoutInfo *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  QToolBarAreaLayoutInfo::sizeHint
            ((QToolBarAreaLayoutInfo *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  QToolBarAreaLayoutInfo::sizeHint
            ((QToolBarAreaLayoutInfo *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  iVar5 = QSize::width((QSize *)0x6f303e);
  iVar5 = -iVar5 * uVar4;
  QSize::height((QSize *)0x6f3055);
  QSize::width((QSize *)0x6f306c);
  QSize::height((QSize *)0x6f3081);
  QRect::adjust((QRect *)CONCAT44(iVar5,in_stack_ffffffffffffff90),(int)((ulong)puVar6 >> 0x20),
                (int)puVar6,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QToolBarAreaLayout::rectHint(const QRect &r) const
{
    int coef = visible ? 1 : -1;

    QRect result = r;

    QSize left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize right_hint = docks[QInternal::RightDock].sizeHint();
    QSize top_hint = docks[QInternal::TopDock].sizeHint();
    QSize bottom_hint = docks[QInternal::BottomDock].sizeHint();

    result.adjust(-left_hint.width()*coef, -top_hint.height()*coef,
                    right_hint.width()*coef, bottom_hint.height()*coef);

    return result;
}